

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int adiak_cmdline(void)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  undefined8 *__ptr;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  int arglist_size;
  char *arglist;
  
  arglist = (char *)0x0;
  iVar3 = adksys_get_cmdline_buffer(&arglist,&arglist_size);
  pcVar2 = arglist;
  uVar6 = 0;
  if (iVar3 == -1) {
    iVar3 = -1;
    __ptr = (undefined8 *)0x0;
  }
  else {
    if (arglist_size < 1) {
      arglist_size = 0;
    }
    uVar8 = (ulong)(uint)arglist_size;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      uVar6 = uVar6 + (arglist[uVar4] == '\0');
    }
    __ptr = (undefined8 *)malloc((ulong)uVar6 * 8 + 8);
    *__ptr = pcVar2;
    iVar3 = 1;
    while( true ) {
      pcVar7 = pcVar2 + 1;
      bVar9 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar9) break;
      cVar1 = *pcVar2;
      pcVar2 = pcVar7;
      if (cVar1 == '\0') {
        lVar5 = (long)iVar3;
        iVar3 = iVar3 + 1;
        __ptr[lVar5] = pcVar7;
      }
    }
    iVar3 = adiak_namevalue("cmdline",2,"runinfo","[%s]",__ptr,(ulong)uVar6);
    iVar3 = -(uint)(iVar3 == -1);
  }
  free(arglist);
  free(__ptr);
  return iVar3;
}

Assistant:

int adiak_cmdline()
{
   int result;
   char *arglist = NULL;
   int  arglist_size, i, j = 0;
   char **myargv = NULL;
   int myargc = 0;
   int retval = -1;

   result = adksys_get_cmdline_buffer(&arglist, &arglist_size);
   if (result == -1)
      goto error;

   for (i = 0; i < arglist_size; i++) {
      if (arglist[i] == '\0')
         myargc++;
   }

   myargv = (char **) malloc(sizeof(char *) * (myargc+1));
   myargv[j++] = arglist;
   for (i = 0; i < arglist_size; i++) {
      if (arglist[i] == '\0')
         myargv[j++] = arglist + i + 1;
   }

   result = adiak_namevalue("cmdline", adiak_general, "runinfo", "[%s]", myargv, myargc);
   if (result == -1)
      goto error;

   retval = 0;
  error:
   if (arglist)
      free(arglist);
   if (myargv)
      free(myargv);
   return retval;
}